

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

void __thiscall
QItemDelegate::doLayout
          (QItemDelegate *this,QStyleOptionViewItem *option,QRect *checkRect,QRect *pixmapRect,
          QRect *textRect,bool hint)

{
  QRect *pQVar1;
  LayoutDirection LVar2;
  Alignment AVar3;
  QWidget *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QStyle *pQVar13;
  QSize QVar14;
  int iVar15;
  int iVar16;
  Representation RVar17;
  Representation RVar18;
  int iVar19;
  Representation RVar20;
  int iVar21;
  Representation RVar22;
  int iVar23;
  Representation RVar24;
  long in_FS_OFFSET;
  QRect QVar25;
  QSize local_88;
  undefined4 uStack_80;
  undefined8 uStack_7c;
  undefined4 local_74;
  char *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = option->widget;
  if (this_00 == (QWidget *)0x0) {
    pQVar13 = QApplication::style();
  }
  else {
    pQVar13 = QWidget::style(this_00);
  }
  bVar4 = (checkRect->x1).m_i <= (checkRect->x2).m_i;
  bVar5 = (checkRect->y1).m_i <= (checkRect->y2).m_i;
  iVar23 = (pixmapRect->x1).m_i;
  iVar19 = (pixmapRect->x2).m_i;
  bVar6 = (pixmapRect->y1).m_i <= (pixmapRect->y2).m_i;
  iVar11 = (textRect->x1).m_i;
  iVar12 = (textRect->y1).m_i;
  iVar15 = (textRect->x2).m_i;
  bVar7 = iVar11 <= iVar15;
  iVar21 = (textRect->y2).m_i;
  bVar8 = iVar12 <= iVar21;
  if (((bVar5 && bVar4) || (bVar6 && iVar23 <= iVar19)) || (bVar8 && bVar7)) {
    iVar10 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x41,0,this_00);
    iVar10 = iVar10 + 1;
    iVar11 = (textRect->x1).m_i;
    iVar12 = (textRect->y1).m_i;
    iVar15 = (textRect->x2).m_i;
    iVar21 = (textRect->y2).m_i;
  }
  else {
    iVar10 = 0;
  }
  iVar16 = 0;
  if (bVar8 && bVar7) {
    iVar16 = iVar10;
  }
  pQVar1 = &(option->super_QStyleOption).rect;
  RVar22.m_i = (pQVar1->x1).m_i;
  RVar20.m_i = (option->super_QStyleOption).rect.y1.m_i;
  uVar9._0_4_ = (pQVar1->x1).m_i;
  uVar9._4_4_ = (pQVar1->y1).m_i;
  (textRect->x1).m_i = iVar11 - iVar16;
  (textRect->x2).m_i = iVar16 + iVar15;
  if (((!bVar6 || iVar23 > iVar19) || !hint) && (iVar21 + 1 == iVar12)) {
    iVar11 = QFontMetrics::height();
    (textRect->y2).m_i = iVar11 + (textRect->y1).m_i + -1;
  }
  iVar11 = 0;
  RVar18.m_i = 0;
  if (bVar6 && iVar23 <= iVar19) {
    QVar14 = QRect::size(pixmapRect);
    iVar11 = iVar10 * 2 + QVar14.wd.m_i.m_i;
    RVar18 = QVar14.ht.m_i;
  }
  if (hint) {
    iVar15 = ((checkRect->y2).m_i - (checkRect->y1).m_i) + 1;
    iVar12 = ((textRect->y2).m_i - (textRect->y1).m_i) + 1;
    if (iVar12 <= RVar18.m_i) {
      iVar12 = RVar18.m_i;
    }
    if (iVar12 < iVar15) {
      iVar12 = iVar15;
    }
    iVar15 = (textRect->x1).m_i;
    iVar21 = (textRect->x2).m_i;
    if (option->decorationPosition < Top) {
      iVar15 = ((iVar21 + iVar11) - iVar15) + 1;
    }
    else {
      iVar15 = (iVar21 - iVar15) + 1;
      if (iVar15 <= iVar11) {
        iVar15 = iVar11;
      }
    }
  }
  else {
    iVar15 = ((option->super_QStyleOption).rect.x2.m_i - (option->super_QStyleOption).rect.x1.m_i) +
             1;
    iVar12 = ((option->super_QStyleOption).rect.y2.m_i - (option->super_QStyleOption).rect.y1.m_i) +
             1;
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  iVar21 = 0;
  if (bVar5 && bVar4) {
    iVar21 = ((iVar10 * 2 + (checkRect->x2).m_i) - (checkRect->x1).m_i) + 1;
    iVar16 = 0;
    if (hint) {
      iVar16 = iVar21;
    }
    iVar15 = iVar16 + iVar15;
    iVar16 = iVar21;
    local_48.x1.m_i = RVar22.m_i;
    if ((option->super_QStyleOption).direction == RightToLeft) {
      iVar16 = iVar15;
      local_48.x1.m_i = (iVar15 + RVar22.m_i) - iVar21;
    }
    local_48.y1.m_i = RVar20.m_i;
    local_48.y2.m_i = RVar20.m_i + iVar12 + -1;
    local_48.x2.m_i = iVar16 + RVar22.m_i + -1;
  }
  local_58.x1.m_i = 0;
  local_58.y1.m_i = 0;
  local_58.x2.m_i = -1;
  local_58.y2.m_i = -1;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  switch(option->decorationPosition) {
  case Left:
    if ((option->super_QStyleOption).direction == LeftToRight) {
      local_68._0_4_ = RVar22.m_i + iVar21;
      local_68._4_4_ = RVar20.m_i;
      RVar17.m_i = RVar20.m_i + iVar12 + -1;
      uStack_60._4_4_ = RVar17.m_i;
      uStack_60._0_4_ = local_68._0_4_ + iVar11 + -1;
      RVar22.m_i = local_68._0_4_ + iVar11;
      local_58.y1.m_i = RVar20.m_i;
      local_58.x1.m_i = RVar22.m_i;
      RVar24.m_i = (iVar15 - (iVar21 + iVar11)) + RVar22.m_i + -1;
      local_58.y2.m_i = RVar17.m_i;
      local_58.x2.m_i = RVar24.m_i;
      break;
    }
    goto LAB_0050385a;
  case Right:
    if ((option->super_QStyleOption).direction != LeftToRight) {
      iVar19 = RVar22.m_i + -1;
      RVar17.m_i = RVar20.m_i + iVar12 + -1;
      uStack_60._4_4_ = RVar17.m_i;
      uStack_60._0_4_ = RVar22.m_i + iVar11 + -1;
      RVar22.m_i = iVar11 + RVar22.m_i;
      local_58.y1.m_i = RVar20.m_i;
      local_58.x1.m_i = RVar22.m_i;
      RVar24.m_i = (iVar19 - iVar21) + iVar15;
      local_58.y2.m_i = RVar17.m_i;
      local_58.x2.m_i = RVar24.m_i;
      local_68 = (undefined1 *)uVar9;
      break;
    }
    RVar22.m_i = RVar22.m_i + iVar21;
LAB_0050385a:
    iVar15 = iVar15 - (iVar21 + iVar11);
    local_58.y1.m_i = RVar20.m_i;
    local_58.x1.m_i = RVar22.m_i;
    RVar24.m_i = iVar15 + RVar22.m_i + -1;
    RVar17.m_i = RVar20.m_i + iVar12 + -1;
    local_58.y2.m_i = RVar17.m_i;
    local_58.x2.m_i = RVar24.m_i;
    local_68._0_4_ = iVar15 + RVar22.m_i;
    local_68._4_4_ = RVar20.m_i;
    uStack_60._4_4_ = RVar17.m_i;
    uStack_60._0_4_ = local_68._0_4_ + iVar11 + -1;
    break;
  case Top:
    iVar11 = 0;
    if (bVar6 && iVar23 <= iVar19) {
      iVar11 = iVar10;
    }
    iVar11 = RVar18.m_i + iVar11;
    if (hint) {
      iVar12 = ((textRect->y2).m_i - (textRect->y1).m_i) + 1;
    }
    else {
      iVar12 = iVar12 - iVar11;
    }
    if ((option->super_QStyleOption).direction == RightToLeft) {
      iVar19 = RVar22.m_i + (iVar15 - iVar21);
    }
    else {
      RVar22.m_i = RVar22.m_i + iVar21;
      iVar19 = (iVar15 - iVar21) + RVar22.m_i;
    }
    local_68._4_4_ = RVar20.m_i;
    local_68._0_4_ = RVar22.m_i;
    RVar24.m_i = iVar19 + -1;
    uStack_60._4_4_ = iVar11 + RVar20.m_i + -1;
    uStack_60._0_4_ = RVar24.m_i;
    RVar20.m_i = iVar11 + RVar20.m_i;
    local_58.y1.m_i = RVar20.m_i;
    local_58.x1.m_i = RVar22.m_i;
    RVar17.m_i = iVar12 + RVar20.m_i + -1;
    local_58.y2.m_i = RVar17.m_i;
    local_58.x2.m_i = RVar24.m_i;
    break;
  case Bottom:
    if (bVar8 && bVar7) {
      (textRect->y2).m_i = (textRect->y2).m_i + iVar10;
    }
    if (hint) {
      iVar12 = ((RVar18.m_i + (textRect->y2).m_i) - (textRect->y1).m_i) + 1;
    }
    if ((option->super_QStyleOption).direction == RightToLeft) {
      iVar19 = (textRect->y2).m_i - (textRect->y1).m_i;
      iVar23 = RVar22.m_i + (iVar15 - iVar21);
    }
    else {
      RVar22.m_i = RVar22.m_i + iVar21;
      iVar19 = (textRect->y2).m_i - (textRect->y1).m_i;
      iVar23 = (iVar15 - iVar21) + RVar22.m_i;
    }
    local_58.y1.m_i = RVar20.m_i;
    local_58.x1.m_i = RVar22.m_i;
    RVar24.m_i = iVar23 + -1;
    RVar17.m_i = iVar19 + RVar20.m_i;
    local_58.y2.m_i = RVar17.m_i;
    local_58.x2.m_i = RVar24.m_i;
    local_68._4_4_ = RVar17.m_i + 1;
    local_68._0_4_ = RVar22.m_i;
    uStack_60._4_4_ = iVar12 + RVar17.m_i + 1 + ~(iVar19 + 1U);
    uStack_60._0_4_ = RVar24.m_i;
    break;
  default:
    local_88.wd.m_i = 2;
    local_74 = 0;
    local_88.ht.m_i = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_70 = "default";
    QMessageLogger::warning((char *)&local_88,"doLayout: decoration position is invalid");
    RVar20.m_i = 0;
    local_68._0_4_ = (pixmapRect->x1).m_i;
    local_68._4_4_ = (pixmapRect->y1).m_i;
    uStack_60._0_4_ = (pixmapRect->x2).m_i;
    uStack_60._4_4_ = (pixmapRect->y2).m_i;
    RVar24.m_i = -1;
    RVar22.m_i = 0;
    RVar17.m_i = RVar24.m_i;
  }
  if (hint) {
    checkRect->x1 = (Representation)local_48.x1.m_i;
    checkRect->y1 = (Representation)local_48.y1.m_i;
    checkRect->x2 = (Representation)local_48.x2.m_i;
    checkRect->y2 = (Representation)local_48.y2.m_i;
    pixmapRect->x1 = (Representation)local_68._0_4_;
    pixmapRect->y1 = (Representation)local_68._4_4_;
    pixmapRect->x2 = (Representation)uStack_60._0_4_;
    pixmapRect->y2 = (Representation)uStack_60._4_4_;
    textRect->x1 = (Representation)local_58.x1.m_i;
    textRect->y1 = (Representation)local_58.y1.m_i;
    textRect->x2 = (Representation)local_58.x2.m_i;
    textRect->y2 = (Representation)local_58.y2.m_i;
  }
  else {
    LVar2 = (option->super_QStyleOption).direction;
    QVar14 = QRect::size(checkRect);
    local_88.wd = QVar14.wd.m_i;
    local_88.ht = QVar14.ht.m_i;
    QVar25 = QStyle::alignedRect(LVar2,(Alignment)0x84,&local_88,&local_48);
    *checkRect = QVar25;
    LVar2 = (option->super_QStyleOption).direction;
    AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
         (option->decorationAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
    QVar14 = QRect::size(pixmapRect);
    local_88.wd = QVar14.wd.m_i;
    local_88.ht = QVar14.ht.m_i;
    QVar25 = QStyle::alignedRect(LVar2,AVar3,&local_88,(QRect *)&local_68);
    *pixmapRect = QVar25;
    if (option->showDecorationSelected == true) {
      textRect->x1 = (Representation)local_58.x1.m_i;
      textRect->y1 = (Representation)local_58.y1.m_i;
      textRect->x2 = (Representation)local_58.x2.m_i;
      textRect->y2 = (Representation)local_58.y2.m_i;
    }
    else {
      LVar2 = (option->super_QStyleOption).direction;
      AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i
           = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             (option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i;
      QVar14 = QRect::size(textRect);
      local_88.wd.m_i = (RVar24.m_i - RVar22.m_i) + 1;
      local_88.ht.m_i = (RVar17.m_i - RVar20.m_i) + 1;
      if (QVar14.wd.m_i.m_i < local_88.wd.m_i) {
        local_88.wd.m_i = QVar14.wd.m_i.m_i;
      }
      if (QVar14.ht.m_i.m_i < local_88.ht.m_i) {
        local_88.ht.m_i = QVar14.ht.m_i.m_i;
      }
      QVar25 = QStyle::alignedRect(LVar2,AVar3,&local_88,&local_58);
      *textRect = QVar25;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::doLayout(const QStyleOptionViewItem &option,
                             QRect *checkRect, QRect *pixmapRect, QRect *textRect,
                             bool hint) const
{
    Q_ASSERT(checkRect && pixmapRect && textRect);
    Q_D(const QItemDelegate);
    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    const bool hasCheck = checkRect->isValid();
    const bool hasPixmap = pixmapRect->isValid();
    const bool hasText = textRect->isValid();
    const bool hasMargin = (hasText | hasPixmap | hasCheck);
    const int frameHMargin = hasMargin ?
                style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, widget) + 1 : 0;
    const int textMargin = hasText ? frameHMargin : 0;
    const int pixmapMargin = hasPixmap ? frameHMargin : 0;
    const int checkMargin = hasCheck ? frameHMargin : 0;
    const int x = option.rect.left();
    const int y = option.rect.top();
    int w, h;

    textRect->adjust(-textMargin, 0, textMargin, 0); // add width padding
    if (textRect->height() == 0 && (!hasPixmap || !hint)) {
        //if there is no text, we still want to have a decent height for the item sizeHint and the editor size
        textRect->setHeight(option.fontMetrics.height());
    }

    QSize pm(0, 0);
    if (hasPixmap) {
        pm = pixmapRect->size();
        pm.rwidth() += 2 * pixmapMargin;
    }
    if (hint) {
        h = qMax(checkRect->height(), qMax(textRect->height(), pm.height()));
        if (option.decorationPosition == QStyleOptionViewItem::Left
            || option.decorationPosition == QStyleOptionViewItem::Right) {
            w = textRect->width() + pm.width();
        } else {
            w = qMax(textRect->width(), pm.width());
        }
    } else {
        w = option.rect.width();
        h = option.rect.height();
    }

    int cw = 0;
    QRect check;
    if (hasCheck) {
        cw = checkRect->width() + 2 * checkMargin;
        if (hint) w += cw;
        if (option.direction == Qt::RightToLeft) {
            check.setRect(x + w - cw, y, cw, h);
        } else {
            check.setRect(x, y, cw, h);
        }
    }

    // at this point w should be the *total* width

    QRect display;
    QRect decoration;
    switch (option.decorationPosition) {
    case QStyleOptionViewItem::Top: {
        if (hasPixmap)
            pm.setHeight(pm.height() + pixmapMargin); // add space
        h = hint ? textRect->height() : h - pm.height();

        if (option.direction == Qt::RightToLeft) {
            decoration.setRect(x, y, w - cw, pm.height());
            display.setRect(x, y + pm.height(), w - cw, h);
        } else {
            decoration.setRect(x + cw, y, w - cw, pm.height());
            display.setRect(x + cw, y + pm.height(), w - cw, h);
        }
        break; }
    case QStyleOptionViewItem::Bottom: {
        if (hasText)
            textRect->setHeight(textRect->height() + textMargin); // add space
        h = hint ? textRect->height() + pm.height() : h;

        if (option.direction == Qt::RightToLeft) {
            display.setRect(x, y, w - cw, textRect->height());
            decoration.setRect(x, y + textRect->height(), w - cw, h - textRect->height());
        } else {
            display.setRect(x + cw, y, w - cw, textRect->height());
            decoration.setRect(x + cw, y + textRect->height(), w - cw, h - textRect->height());
        }
        break; }
    case QStyleOptionViewItem::Left: {
        if (option.direction == Qt::LeftToRight) {
            decoration.setRect(x + cw, y, pm.width(), h);
            display.setRect(decoration.right() + 1, y, w - pm.width() - cw, h);
        } else {
            display.setRect(x, y, w - pm.width() - cw, h);
            decoration.setRect(display.right() + 1, y, pm.width(), h);
        }
        break; }
    case QStyleOptionViewItem::Right: {
        if (option.direction == Qt::LeftToRight) {
            display.setRect(x + cw, y, w - pm.width() - cw, h);
            decoration.setRect(display.right() + 1, y, pm.width(), h);
        } else {
            decoration.setRect(x, y, pm.width(), h);
            display.setRect(decoration.right() + 1, y, w - pm.width() - cw, h);
        }
        break; }
    default:
        qWarning("doLayout: decoration position is invalid");
        decoration = *pixmapRect;
        break;
    }

    if (!hint) { // we only need to do the internal layout if we are going to paint
        *checkRect = QStyle::alignedRect(option.direction, Qt::AlignCenter,
                                         checkRect->size(), check);
        *pixmapRect = QStyle::alignedRect(option.direction, option.decorationAlignment,
                                          pixmapRect->size(), decoration);
        // the text takes up all available space, unless the decoration is not shown as selected
        if (option.showDecorationSelected)
            *textRect = display;
        else
            *textRect = QStyle::alignedRect(option.direction, option.displayAlignment,
                                            textRect->size().boundedTo(display.size()), display);
    } else {
        *checkRect = check;
        *pixmapRect = decoration;
        *textRect = display;
    }
}